

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>::
set_result(cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>
           *this,shared_ptr<nuraft::resp_msg> *result,shared_ptr<nuraft::rpc_exception> *err,
          cmd_result_code code)

{
  _Manager_type p_Var1;
  _Manager_type p_Var2;
  
  this->code_ = code;
  std::mutex::lock(&this->lock_);
  std::__shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->result_).super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>,
             &result->super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->err_).super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>,
             &err->super___shared_ptr<nuraft::rpc_exception,_(__gnu_cxx::_Lock_policy)2>);
  this->has_result_ = true;
  p_Var1 = (this->handler2_).super__Function_base._M_manager;
  p_Var2 = (this->handler_).super__Function_base._M_manager;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (p_Var2 != (_Manager_type)0x0 || p_Var1 != (_Manager_type)0x0) {
    if ((this->handler2_).super__Function_base._M_manager == (_Manager_type)0x0) {
      if ((this->handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::
        function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
        ::operator()(&this->handler_,result,err);
      }
    }
    else {
      std::
      function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
      ::operator()(&this->handler2_,this,err);
    }
  }
  std::condition_variable::notify_all();
  return;
}

Assistant:

void set_result(T& result, TE& err, cmd_result_code code = cmd_result_code::OK) {
        bool call_handler = false;
        code_ = code;
        {   std::lock_guard<std::mutex> guard(lock_);
            result_ = result;
            err_ = err;
            has_result_ = true;
            if (handler_ || handler2_) call_handler = true;
        }
        if (call_handler) {
            if (handler2_) handler2_(*this, err);
            else if (handler_) handler_(result, err);
        }
        cv_.notify_all();
    }